

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O1

void __thiscall
llvm::yaml::NullNode::NullNode
          (NullNode *this,
          unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *D)

{
  char *pcVar1;
  Token *pTVar2;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_anchor_01099770;
  (this->super_Node).Doc = D;
  (this->super_Node).SourceRange.Start.Ptr = (char *)0x0;
  (this->super_Node).SourceRange.End.Ptr = (char *)0x0;
  (this->super_Node).TypeID = 0;
  (this->super_Node).Anchor.Data = (char *)0x0;
  (this->super_Node).Anchor.Length = 0;
  (this->super_Node).Tag.Data = (char *)0x0;
  (this->super_Node).Tag.Length = 0;
  pTVar2 = Scanner::peekNext(*(Scanner **)
                              &((D->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  pcVar1 = (pTVar2->Range).Data;
  (this->super_Node).SourceRange.Start.Ptr = pcVar1;
  (this->super_Node).SourceRange.End.Ptr = pcVar1;
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_anchor_01099790;
  return;
}

Assistant:

NullNode(std::unique_ptr<Document> &D)
      : Node(NK_Null, D, StringRef(), StringRef()) {}